

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::operator*(APInt *this,APInt *RHS)

{
  uint uVar1;
  uint64_t *dst;
  long *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  APInt AVar3;
  
  uVar1 = RHS->BitWidth;
  if (uVar1 == *(uint *)(in_RDX + 1)) {
    if (uVar1 < 0x41) {
      APInt(this,uVar1,*in_RDX * (RHS->U).VAL,false);
      uVar2 = extraout_RDX;
    }
    else {
      dst = getMemory((uint)((ulong)uVar1 + 0x3f >> 6));
      uVar1 = RHS->BitWidth;
      this->BitWidth = uVar1;
      (this->U).pVal = dst;
      tcMultiply(dst,(RHS->U).pVal,(WordType *)*in_RDX,(uint)((ulong)uVar1 + 0x3f >> 6));
      clearUnusedBits(this);
      uVar2 = extraout_RDX_00;
    }
    AVar3._8_8_ = uVar2;
    AVar3.U.pVal = (uint64_t *)this;
    return AVar3;
  }
  __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0xe6,"APInt llvm::APInt::operator*(const APInt &) const");
}

Assistant:

APInt APInt::operator*(const APInt& RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  if (isSingleWord())
    return APInt(BitWidth, U.VAL * RHS.U.VAL);

  APInt Result(getMemory(getNumWords()), getBitWidth());

  tcMultiply(Result.U.pVal, U.pVal, RHS.U.pVal, getNumWords());

  Result.clearUnusedBits();
  return Result;
}